

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<kj::Directory,_std::nullptr_t> __thiscall kj::newDiskDirectory(kj *this,OwnFd *fd)

{
  Directory *extraout_RDX;
  Own<kj::Directory,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::DiskDirectory,_std::nullptr_t> local_28;
  
  heap<kj::(anonymous_namespace)::DiskDirectory,kj::OwnFd>((kj *)&local_28,fd);
  *(Disposer **)this = local_28.disposer;
  *(DiskDirectory **)(this + 8) = local_28.ptr;
  local_28.ptr = (DiskDirectory *)0x0;
  Own<kj::(anonymous_namespace)::DiskDirectory,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<Directory> newDiskDirectory(kj::OwnFd fd) {
  return heap<DiskDirectory>(kj::mv(fd));
}